

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRr.c
# Opt level: O1

int Abc_NtkRRWindow(Abc_RRMan_t *p)

{
  uint *puVar1;
  undefined4 uVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Obj_t *pAVar4;
  long *plVar5;
  long *plVar6;
  long lVar7;
  long lVar8;
  void *pvVar9;
  Abc_Obj_t *pAVar10;
  Vec_Ptr_t *pVVar11;
  Vec_Ptr_t *pVVar12;
  bool bVar13;
  bool bVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int *piVar18;
  void **ppvVar19;
  Vec_Ptr_t *pVVar20;
  Abc_Ntk_t *pAVar21;
  char *pcVar22;
  Abc_Obj_t *pAVar23;
  Abc_Obj_t *pAVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  int in_EDX;
  int extraout_EDX;
  int extraout_EDX_00;
  uint uVar28;
  uint uVar29;
  int Fill;
  ulong extraout_RDX;
  ulong uVar30;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  long lVar31;
  long lVar32;
  int iVar33;
  
  pAVar23 = p->pFanout;
  pAVar24 = pAVar23;
  if (pAVar23 == (Abc_Obj_t *)0x0) {
    pAVar24 = p->pNode;
  }
  pAVar23 = (&p->pNode)[pAVar23 == (Abc_Obj_t *)0x0];
  pAVar3 = p->pNtk;
  iVar15 = (*(uint *)&p->pFanin->field_0x14 >> 0xc) - p->nFaninLevels;
  iVar17 = 0;
  if (0 < iVar15) {
    iVar17 = iVar15;
  }
  uVar16 = (*(uint *)&pAVar24->field_0x14 >> 0xc) + p->nFanoutLevels;
  if ((pAVar3->vTravIds).pArray == (int *)0x0) {
    iVar15 = pAVar3->vObjs->nSize;
    uVar30 = (long)iVar15 + 500;
    iVar33 = (int)uVar30;
    if ((pAVar3->vTravIds).nCap < iVar33) {
      piVar18 = (int *)malloc(uVar30 * 4);
      (pAVar3->vTravIds).pArray = piVar18;
      if (piVar18 == (int *)0x0) goto LAB_0029e36a;
      (pAVar3->vTravIds).nCap = iVar33;
      in_EDX = extraout_EDX;
    }
    if (-500 < iVar15) {
      memset((pAVar3->vTravIds).pArray,0,(uVar30 & 0xffffffff) << 2);
      in_EDX = extraout_EDX_00;
    }
    (pAVar3->vTravIds).nSize = iVar33;
  }
  iVar15 = pAVar3->nTravIds;
  pAVar3->nTravIds = iVar15 + 1;
  if (0x3ffffffe < iVar15) goto LAB_0029e32c;
  pAVar3 = p->pFanin->pNtk;
  iVar15 = pAVar3->nTravIds;
  iVar33 = p->pFanin->Id;
  Vec_IntFillExtra(&pAVar3->vTravIds,iVar33 + 1,in_EDX);
  if (((long)iVar33 < 0) || ((pAVar3->vTravIds).nSize <= iVar33)) {
LAB_0029e291:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  (pAVar3->vTravIds).pArray[iVar33] = iVar15;
  pAVar4 = p->pFanin;
  pVVar20 = p->vFaninLeaves;
  uVar28 = pVVar20->nCap;
  if (pVVar20->nSize == uVar28) {
    if ((int)uVar28 < 0x10) {
      if (pVVar20->pArray == (void **)0x0) {
        ppvVar19 = (void **)malloc(0x80);
      }
      else {
        ppvVar19 = (void **)realloc(pVVar20->pArray,0x80);
      }
      pVVar20->pArray = ppvVar19;
      iVar15 = 0x10;
    }
    else {
      iVar15 = uVar28 * 2;
      if (iVar15 <= (int)uVar28) goto LAB_0029d910;
      if (pVVar20->pArray == (void **)0x0) {
        ppvVar19 = (void **)malloc((ulong)uVar28 << 4);
      }
      else {
        ppvVar19 = (void **)realloc(pVVar20->pArray,(ulong)uVar28 << 4);
      }
      pVVar20->pArray = ppvVar19;
    }
    pVVar20->nCap = iVar15;
  }
LAB_0029d910:
  iVar15 = pVVar20->nSize;
  uVar28 = iVar15 + 1;
  uVar30 = (ulong)uVar28;
  pVVar20->nSize = uVar28;
  pVVar20->pArray[iVar15] = pAVar4;
  do {
    pVVar20 = p->vFaninLeaves;
    lVar31 = (long)pVVar20->nSize;
    uVar28 = 0;
    if (0 < lVar31) {
      lVar25 = 0;
      uVar28 = 0;
      do {
        uVar29 = *(uint *)((long)pVVar20->pArray[lVar25] + 0x14) >> 0xc;
        uVar30 = (ulong)uVar29;
        if (uVar28 <= uVar29) {
          uVar28 = uVar29;
        }
        lVar25 = lVar25 + 1;
      } while (lVar31 != lVar25);
    }
    if ((int)uVar28 <= iVar17) break;
    if (0 < pVVar20->nSize) {
      lVar25 = 0;
      do {
        if (pVVar20->nSize <= lVar25) goto LAB_0029e2b0;
        plVar5 = (long *)pVVar20->pArray[lVar25];
        if ((uVar28 == *(uint *)((long)plVar5 + 0x14) >> 0xc) && (0 < *(int *)((long)plVar5 + 0x1c))
           ) {
          lVar32 = 0;
          do {
            plVar6 = *(long **)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                               (long)*(int *)(plVar5[4] + lVar32 * 4) * 8);
            lVar7 = *plVar6;
            iVar15 = (int)plVar6[2];
            Vec_IntFillExtra((Vec_Int_t *)(lVar7 + 0xe0),iVar15 + 1,(int)uVar30);
            if (((long)iVar15 < 0) || (*(int *)(lVar7 + 0xe4) <= iVar15)) goto LAB_0029e272;
            lVar8 = *plVar6;
            iVar33 = *(int *)(lVar8 + 0xd8);
            uVar30 = extraout_RDX;
            if (*(int *)(*(long *)(lVar7 + 0xe8) + (long)iVar15 * 4) != iVar33) {
              iVar15 = (int)plVar6[2];
              Vec_IntFillExtra((Vec_Int_t *)(lVar8 + 0xe0),iVar15 + 1,(int)extraout_RDX);
              if (((long)iVar15 < 0) || (*(int *)(lVar8 + 0xe4) <= iVar15)) goto LAB_0029e291;
              *(int *)(*(long *)(lVar8 + 0xe8) + (long)iVar15 * 4) = iVar33;
              uVar29 = pVVar20->nCap;
              if (pVVar20->nSize == uVar29) {
                if ((int)uVar29 < 0x10) {
                  if (pVVar20->pArray == (void **)0x0) {
                    ppvVar19 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar19 = (void **)realloc(pVVar20->pArray,0x80);
                  }
                  iVar15 = 0x10;
                }
                else {
                  iVar15 = uVar29 * 2;
                  if (iVar15 <= (int)uVar29) goto LAB_0029dab1;
                  if (pVVar20->pArray == (void **)0x0) {
                    ppvVar19 = (void **)malloc((ulong)uVar29 << 4);
                  }
                  else {
                    ppvVar19 = (void **)realloc(pVVar20->pArray,(ulong)uVar29 << 4);
                  }
                }
                pVVar20->pArray = ppvVar19;
                pVVar20->nCap = iVar15;
              }
LAB_0029dab1:
              iVar15 = pVVar20->nSize;
              uVar29 = iVar15 + 1;
              uVar30 = (ulong)uVar29;
              pVVar20->nSize = uVar29;
              pVVar20->pArray[iVar15] = plVar6;
            }
            lVar32 = lVar32 + 1;
          } while (lVar32 < *(int *)((long)plVar5 + 0x1c));
        }
        lVar25 = lVar25 + 1;
      } while (lVar25 != lVar31);
    }
    uVar29 = pVVar20->nSize;
    if ((long)(int)uVar29 < 1) {
      iVar15 = 0;
    }
    else {
      uVar30 = 0;
      uVar27 = 0;
      do {
        pvVar9 = pVVar20->pArray[uVar30];
        uVar26 = uVar27;
        if (uVar28 != *(uint *)((long)pvVar9 + 0x14) >> 0xc) {
          if (uVar29 <= (uint)uVar27) goto LAB_0029e2cf;
          uVar26 = (ulong)((uint)uVar27 + 1);
          pVVar20->pArray[uVar27] = pvVar9;
        }
        iVar15 = (int)uVar26;
        uVar30 = uVar30 + 1;
        uVar27 = uVar26;
      } while ((long)(int)uVar29 != uVar30);
    }
    if ((int)uVar29 < iVar15) goto LAB_0029e2ee;
    pVVar20->nSize = iVar15;
  } while (iVar15 < 0x7d1);
  pAVar3 = p->pNtk;
  if ((pAVar3->vTravIds).pArray == (int *)0x0) {
    iVar15 = pAVar3->vObjs->nSize;
    uVar27 = (long)iVar15 + 500;
    iVar33 = (int)uVar27;
    if ((pAVar3->vTravIds).nCap < iVar33) {
      piVar18 = (int *)malloc(uVar27 * 4);
      (pAVar3->vTravIds).pArray = piVar18;
      if (piVar18 == (int *)0x0) goto LAB_0029e36a;
      (pAVar3->vTravIds).nCap = iVar33;
      uVar30 = extraout_RDX_00;
    }
    if (-500 < iVar15) {
      memset((pAVar3->vTravIds).pArray,0,(uVar27 & 0xffffffff) << 2);
      uVar30 = extraout_RDX_01;
    }
    (pAVar3->vTravIds).nSize = iVar33;
  }
  iVar15 = pAVar3->nTravIds;
  pAVar3->nTravIds = iVar15 + 1;
  if (0x3ffffffe < iVar15) {
LAB_0029e32c:
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                  ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  pVVar20 = p->vFaninLeaves;
  if (0 < pVVar20->nSize) {
    lVar31 = 0;
    do {
      lVar25 = *pVVar20->pArray[lVar31];
      uVar2 = *(undefined4 *)(lVar25 + 0xd8);
      iVar15 = (int)*(long *)((long)pVVar20->pArray[lVar31] + 0x10);
      Vec_IntFillExtra((Vec_Int_t *)(lVar25 + 0xe0),iVar15 + 1,(int)uVar30);
      if (((long)iVar15 < 0) || (*(int *)(lVar25 + 0xe4) <= iVar15)) goto LAB_0029e291;
      *(undefined4 *)(*(long *)(lVar25 + 0xe8) + (long)iVar15 * 4) = uVar2;
      lVar31 = lVar31 + 1;
      pVVar20 = p->vFaninLeaves;
      uVar30 = extraout_RDX_02;
    } while (lVar31 < pVVar20->nSize);
  }
  do {
    pVVar20 = p->vFaninLeaves;
    lVar31 = (long)pVVar20->nSize;
    if (lVar31 < 1) {
      uVar28 = 1000000000;
    }
    else {
      uVar28 = 1000000000;
      lVar25 = 0;
      do {
        uVar29 = *(uint *)((long)pVVar20->pArray[lVar25] + 0x14) >> 0xc;
        if (uVar29 <= uVar28) {
          uVar28 = uVar29;
        }
        lVar25 = lVar25 + 1;
      } while (lVar31 != lVar25);
    }
    if ((int)uVar16 < (int)uVar28) break;
    if (0 < pVVar20->nSize) {
      pVVar11 = p->vFanoutRoots;
      lVar25 = 0;
      do {
        if (pVVar20->nSize <= lVar25) {
LAB_0029e2b0:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pAVar4 = (Abc_Obj_t *)pVVar20->pArray[lVar25];
        if ((uVar28 == *(uint *)&pAVar4->field_0x14 >> 0xc) && (0 < (pAVar4->vFanouts).nSize)) {
          lVar32 = 0;
          bVar14 = false;
          do {
            pAVar10 = (Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[(pAVar4->vFanouts).pArray[lVar32]];
            uVar29 = *(uint *)&pAVar10->field_0x14 >> 0xc;
            bVar13 = true;
            if (((uVar29 <= uVar16) && (1 < (*(uint *)&pAVar10->field_0x14 & 0xf) - 3)) &&
               ((bVar13 = bVar14, pAVar4 != pAVar23 || (pAVar10 != pAVar24)))) {
              pAVar3 = pAVar10->pNtk;
              iVar15 = pAVar10->Id;
              Vec_IntFillExtra(&pAVar3->vTravIds,iVar15 + 1,uVar29);
              if (((long)iVar15 < 0) || ((pAVar3->vTravIds).nSize <= iVar15)) {
LAB_0029e272:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                              ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              pAVar21 = pAVar10->pNtk;
              iVar33 = pAVar21->nTravIds;
              if ((pAVar3->vTravIds).pArray[iVar15] != iVar33) {
                iVar15 = pAVar10->Id;
                Vec_IntFillExtra(&pAVar21->vTravIds,iVar15 + 1,Fill);
                if (((long)iVar15 < 0) || ((pAVar21->vTravIds).nSize <= iVar15)) goto LAB_0029e291;
                (pAVar21->vTravIds).pArray[iVar15] = iVar33;
                uVar29 = pVVar20->nCap;
                if (pVVar20->nSize == uVar29) {
                  if ((int)uVar29 < 0x10) {
                    if (pVVar20->pArray == (void **)0x0) {
                      ppvVar19 = (void **)malloc(0x80);
                    }
                    else {
                      ppvVar19 = (void **)realloc(pVVar20->pArray,0x80);
                    }
                    iVar15 = 0x10;
                  }
                  else {
                    iVar15 = uVar29 * 2;
                    if (iVar15 <= (int)uVar29) goto LAB_0029de2c;
                    if (pVVar20->pArray == (void **)0x0) {
                      ppvVar19 = (void **)malloc((ulong)uVar29 << 4);
                    }
                    else {
                      ppvVar19 = (void **)realloc(pVVar20->pArray,(ulong)uVar29 << 4);
                    }
                  }
                  pVVar20->pArray = ppvVar19;
                  pVVar20->nCap = iVar15;
                }
LAB_0029de2c:
                iVar15 = pVVar20->nSize;
                pVVar20->nSize = iVar15 + 1;
                pVVar20->pArray[iVar15] = pAVar10;
              }
            }
            lVar32 = lVar32 + 1;
            bVar14 = bVar13;
          } while (lVar32 < (pAVar4->vFanouts).nSize);
          if (bVar13) {
            uVar29 = pVVar11->nCap;
            if (pVVar11->nSize == uVar29) {
              if ((int)uVar29 < 0x10) {
                if (pVVar11->pArray == (void **)0x0) {
                  ppvVar19 = (void **)malloc(0x80);
                }
                else {
                  ppvVar19 = (void **)realloc(pVVar11->pArray,0x80);
                }
                iVar15 = 0x10;
              }
              else {
                iVar15 = uVar29 * 2;
                if (iVar15 <= (int)uVar29) goto LAB_0029ded5;
                if (pVVar11->pArray == (void **)0x0) {
                  ppvVar19 = (void **)malloc((ulong)uVar29 << 4);
                }
                else {
                  ppvVar19 = (void **)realloc(pVVar11->pArray,(ulong)uVar29 << 4);
                }
              }
              pVVar11->pArray = ppvVar19;
              pVVar11->nCap = iVar15;
            }
LAB_0029ded5:
            iVar15 = pVVar11->nSize;
            pVVar11->nSize = iVar15 + 1;
            pVVar11->pArray[iVar15] = pAVar4;
          }
        }
        lVar25 = lVar25 + 1;
      } while (lVar25 != lVar31);
    }
    uVar29 = pVVar20->nSize;
    if ((long)(int)uVar29 < 1) {
      iVar15 = 0;
    }
    else {
      lVar31 = 0;
      uVar30 = 0;
      do {
        pvVar9 = pVVar20->pArray[lVar31];
        uVar27 = uVar30;
        if (uVar28 != *(uint *)((long)pvVar9 + 0x14) >> 0xc) {
          if (uVar29 <= (uint)uVar30) {
LAB_0029e2cf:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
          }
          uVar27 = (ulong)((uint)uVar30 + 1);
          pVVar20->pArray[uVar30] = pvVar9;
        }
        iVar15 = (int)uVar27;
        lVar31 = lVar31 + 1;
        uVar30 = uVar27;
      } while ((int)uVar29 != lVar31);
    }
    if ((int)uVar29 < iVar15) {
LAB_0029e2ee:
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
    }
    pVVar20->nSize = iVar15;
  } while (iVar15 < 0x7d1);
  pVVar20 = p->vFanoutRoots;
  if (0 < pVVar20->nSize) {
    lVar31 = 0;
    do {
      puVar1 = (uint *)((long)pVVar20->pArray[lVar31] + 0x14);
      *puVar1 = *puVar1 | 0x10;
      lVar31 = lVar31 + 1;
      pVVar20 = p->vFanoutRoots;
    } while (lVar31 < pVVar20->nSize);
  }
  iVar15 = Abc_NtkRRTfo_rec(pAVar24,p->vRoots,uVar16 + 1);
  pVVar20 = p->vFanoutRoots;
  if (0 < pVVar20->nSize) {
    lVar31 = 0;
    do {
      puVar1 = (uint *)((long)pVVar20->pArray[lVar31] + 0x14);
      *puVar1 = *puVar1 & 0xffffffef;
      lVar31 = lVar31 + 1;
      pVVar20 = p->vFanoutRoots;
    } while (lVar31 < pVVar20->nSize);
  }
  if (iVar15 == 0) {
    iVar17 = 0;
  }
  else {
    pAVar3 = p->pNtk;
    if ((pAVar3->vTravIds).pArray == (int *)0x0) {
      iVar15 = pAVar3->vObjs->nSize;
      uVar30 = (long)iVar15 + 500;
      iVar33 = (int)uVar30;
      if ((pAVar3->vTravIds).nCap < iVar33) {
        piVar18 = (int *)malloc(uVar30 * 4);
        (pAVar3->vTravIds).pArray = piVar18;
        if (piVar18 == (int *)0x0) {
LAB_0029e36a:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        (pAVar3->vTravIds).nCap = iVar33;
      }
      if (-500 < iVar15) {
        memset((pAVar3->vTravIds).pArray,0,(uVar30 & 0xffffffff) << 2);
      }
      (pAVar3->vTravIds).nSize = iVar33;
    }
    iVar15 = pAVar3->nTravIds;
    pAVar3->nTravIds = iVar15 + 1;
    if (0x3ffffffe < iVar15) goto LAB_0029e32c;
    pVVar20 = p->vRoots;
    if (0 < pVVar20->nSize) {
      lVar31 = 0;
      do {
        Abc_NtkRRTfi_rec((Abc_Obj_t *)pVVar20->pArray[lVar31],p->vLeaves,p->vCone,iVar17);
        lVar31 = lVar31 + 1;
        pVVar20 = p->vRoots;
      } while (lVar31 < pVVar20->nSize);
    }
    pAVar3 = p->pNtk;
    if (pAVar3->ntkType != ABC_NTK_STRASH) {
      __assert_fail("Abc_NtkIsStrash(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRr.c"
                    ,0x2aa,
                    "Abc_Ntk_t *Abc_NtkWindow(Abc_Ntk_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
    }
    pVVar11 = p->vLeaves;
    pVVar12 = p->vCone;
    pAVar21 = Abc_NtkAlloc(ABC_NTK_STRASH,pAVar3->ntkFunc,1);
    pcVar22 = Extra_UtilStrsav("temp");
    pAVar21->pName = pcVar22;
    pAVar23 = Abc_AigConst1(pAVar21);
    pAVar24 = Abc_AigConst1(pAVar3);
    (pAVar24->field_6).pCopy = pAVar23;
    if (0 < pVVar11->nSize) {
      lVar31 = 0;
      do {
        pvVar9 = pVVar11->pArray[lVar31];
        pAVar23 = Abc_NtkCreateObj(pAVar21,ABC_OBJ_PI);
        *(Abc_Obj_t **)((long)pvVar9 + 0x40) = pAVar23;
        lVar31 = lVar31 + 1;
      } while (lVar31 < pVVar11->nSize);
    }
    iVar17 = pVVar12->nSize;
    if (0 < iVar17) {
      lVar31 = 0;
      do {
        plVar5 = (long *)pVVar12->pArray[lVar31];
        lVar25 = *(long *)(*(long *)(*plVar5 + 0x20) + 8);
        pAVar23 = Abc_AigAnd((Abc_Aig_t *)pAVar21->pManFunc,
                             (Abc_Obj_t *)
                             ((ulong)(*(uint *)((long)plVar5 + 0x14) >> 10 & 1) ^
                             *(ulong *)(*(long *)(lVar25 + (long)*(int *)plVar5[4] * 8) + 0x40)),
                             (Abc_Obj_t *)
                             ((ulong)(*(uint *)((long)plVar5 + 0x14) >> 0xb & 1) ^
                             *(ulong *)(*(long *)(lVar25 + (long)((int *)plVar5[4])[1] * 8) + 0x40))
                            );
        plVar5[8] = (long)pAVar23;
        lVar31 = lVar31 + 1;
        iVar17 = pVVar12->nSize;
      } while (lVar31 < iVar17);
    }
    if (iVar17 != pAVar21->nObjCounts[7]) {
      printf("Warning: Structural hashing during windowing reduced %d nodes (this is a bug).\n");
    }
    if (0 < pVVar20->nSize) {
      lVar31 = 0;
      do {
        pvVar9 = pVVar20->pArray[lVar31];
        if ((*(byte *)((long)pvVar9 + 0x40) & 1) != 0) {
          __assert_fail("!Abc_ObjIsComplement(pObj->pCopy)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRr.c"
                        ,0x2be,
                        "Abc_Ntk_t *Abc_NtkWindow(Abc_Ntk_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                       );
        }
        pAVar23 = Abc_NtkCreateObj(pAVar21,ABC_OBJ_PO);
        Abc_ObjAddFanin(pAVar23,*(Abc_Obj_t **)((long)pvVar9 + 0x40));
        lVar31 = lVar31 + 1;
      } while (lVar31 < pVVar20->nSize);
    }
    Abc_NtkAddDummyPiNames(pAVar21);
    Abc_NtkAddDummyPoNames(pAVar21);
    iVar17 = Abc_NtkCheck(pAVar21);
    if (iVar17 == 0) {
      puts("Abc_NtkWindow: The network check has failed.");
      pAVar21 = (Abc_Ntk_t *)0x0;
    }
    p->pWnd = pAVar21;
    iVar17 = 1;
  }
  return iVar17;
}

Assistant:

int Abc_NtkRRWindow( Abc_RRMan_t * p )
{
    Abc_Obj_t * pObj, * pEdgeFanin, * pEdgeFanout;
    int i, LevelMin, LevelMax, RetValue;

    // get the edge
    pEdgeFanout = p->pFanout? p->pFanout : p->pNode;
    pEdgeFanin  = p->pFanout? p->pNode : p->pFanin;
    // get the minimum and maximum levels of the window
    LevelMin = Abc_MaxInt( 0, ((int)p->pFanin->Level) - p->nFaninLevels );
    LevelMax = (int)pEdgeFanout->Level + p->nFanoutLevels;

    // start the TFI leaves with the fanin
    Abc_NtkIncrementTravId( p->pNtk );
    Abc_NodeSetTravIdCurrent( p->pFanin );
    Vec_PtrPush( p->vFaninLeaves, p->pFanin );
    // mark the TFI cone and collect the leaves down to the given level
    while ( Abc_NtkRRTfi_int(p->vFaninLeaves, LevelMin) );

    // mark the leaves with the new TravId
    Abc_NtkIncrementTravId( p->pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vFaninLeaves, pObj, i )
        Abc_NodeSetTravIdCurrent( pObj );
    // traverse the TFO cone of the leaves (while skipping the edge)
    // (a) mark the nodes in the cone using the current TravId
    // (b) collect the nodes that have external fanouts into p->vFanoutRoots
    while ( Abc_NtkRRTfo_int(p->vFaninLeaves, p->vFanoutRoots, LevelMax, pEdgeFanin, pEdgeFanout) );

    // mark the fanout roots
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vFanoutRoots, pObj, i )
        pObj->fMarkA = 1;
    // collect roots reachable from the fanout (p->vRoots)
    RetValue = Abc_NtkRRTfo_rec( pEdgeFanout, p->vRoots, LevelMax + 1 );
    // unmark the fanout roots
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vFanoutRoots, pObj, i )
        pObj->fMarkA = 0;

    // return if the window is infeasible
    if ( RetValue == 0 )
        return 0;

    // collect the DFS-ordered new cone (p->vCone) and new leaves (p->vLeaves)
    // using the previous marks coming from the TFO cone
    Abc_NtkIncrementTravId( p->pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vRoots, pObj, i )
        Abc_NtkRRTfi_rec( pObj, p->vLeaves, p->vCone, LevelMin );

    // create a new network
    p->pWnd = Abc_NtkWindow( p->pNtk, p->vLeaves, p->vCone, p->vRoots );
    return 1;
}